

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

Options * parseOptions(int argc,char **argv)

{
  int iVar1;
  ostream *this;
  long in_RDX;
  int in_ESI;
  Options *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar2;
  int i;
  int c;
  Options *opts;
  value_type *in_stack_ffffffffffffff08;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  Options *in_stack_ffffffffffffff50;
  allocator local_89;
  string local_88 [32];
  int local_68;
  allocator local_61;
  string local_60 [24];
  char **in_stack_ffffffffffffffb8;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffffc0;
  
  Options::Options(in_stack_ffffffffffffff50);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              do {
                iVar1 = getopt_long(in_ESI,in_RDX,"",parseOptions::longOpts,0);
                if (iVar1 == -1) {
                  for (local_68 = _optind; local_68 < in_ESI; local_68 = local_68 + 1) {
                    __x = (value_type *)&in_RDI->files;
                    this_00 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                **)(in_RDX + (long)local_68 * 8);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_88,(char *)this_00,&local_89);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(this_00,__x);
                    std::__cxx11::string::~string(local_88);
                    std::allocator<char>::~allocator((allocator<char> *)&local_89);
                  }
                  return in_RDI;
                }
              } while (iVar1 == 0);
              if (iVar1 != 0x1001) break;
              std::__cxx11::string::operator=((string *)in_RDI,(char *)_optarg);
            }
            if (iVar1 != 0x1002) break;
            atoi((char *)_optarg);
            pVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                              (in_stack_ffffffffffffff30,
                               (value_type_conflict1 *)in_stack_ffffffffffffff28);
            in_stack_ffffffffffffffc0 = pVar2.first._M_node;
          }
          if (iVar1 != 0x1003) break;
          in_stack_ffffffffffffff28 = &in_RDI->publish;
          in_stack_ffffffffffffff30 = _optarg;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_60,(char *)in_stack_ffffffffffffff30,&local_61);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          std::__cxx11::string::~string(local_60);
          std::allocator<char>::~allocator((allocator<char> *)&local_61);
        }
        if (iVar1 != 0x1004) break;
        in_RDI->record = true;
      }
      if (iVar1 != 0x1005) break;
      std::__cxx11::string::operator=((string *)&in_RDI->filename,(char *)_optarg);
    }
    if (iVar1 != 0x1337) break;
    usage((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(char **)in_stack_ffffffffffffff08);
  }
  if (iVar1 != 0x1338) {
    this = std::operator<<((ostream *)&std::cerr,"Invalid option");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  version((int)((ulong)in_stack_ffffffffffffffc0._M_node >> 0x20),in_stack_ffffffffffffffb8);
  exit(0);
}

Assistant:

Options parseOptions(int argc, char** argv) {
  Options opts;

  while (1) {
    static struct option longOpts[] = {
      {"subscribe", required_argument, 0,       0x1001},
      {"vcid",      required_argument, 0,       0x1002},
      {"publish",   required_argument, 0,       0x1003},
      {"record" ,   no_argument,       0,       0x1004},
      {"filename" , required_argument, 0,       0x1005},
      {"help",      no_argument,       nullptr, 0x1337},
      {"version",   no_argument,       nullptr, 0x1338},
      {nullptr,     0,                 nullptr, 0},
    };

    auto c = getopt_long(argc, argv, "", longOpts, nullptr);
    if (c == -1) {
      break;
    }

    switch (c) {
    case 0:
      break;
    case 0x1001:
      opts.subscribe = optarg;
      break;
    case 0x1002:
      opts.vcids.insert(atoi(optarg));
      break;
    case 0x1003:
      opts.publish.push_back(optarg);
      break;
    case 0x1004:
      opts.record = true;
      break;
    case 0x1005:
      opts.filename = optarg;
      break;
    case 0x1337:
      usage(argc, argv);
      break;
    case 0x1338:
      version(argc, argv);
      exit(0);
      break;
    default:
      std::cerr << "Invalid option" << std::endl;
      exit(1);
    }
  }

  for (int i = optind; i < argc; i++) {
    opts.files.push_back(argv[i]);
  }

  return opts;
}